

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O3

nametree_entry_t *
ndn_nametree_prefix_match
          (ndn_nametree_t *nametree,uint8_t *name,size_t len,NDN_NAMETREE_ENTRY_TYPE type)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t __n;
  ndn_nametree_t *__s2;
  
  if (1 < len) {
    uVar5 = (ulong)(0xfc < name[1]) * 2 + 2;
    uVar7 = 0;
    if (len <= uVar5) {
      return (nametree_entry_t *)0x0;
    }
    uVar4 = 0xffff;
    while( true ) {
      uVar6 = (ulong)name[uVar5 + 1] + 2;
      __n = 0x24;
      if (uVar6 < 0x24) {
        __n = uVar6;
      }
      uVar1 = *(ushort *)(nametree + uVar7 * 0x2e + 0x26);
      if (uVar1 == 0xffff) break;
      while( true ) {
        uVar7 = (ulong)uVar1;
        __s2 = nametree + uVar7 * 0x2e;
        iVar2 = memcmp(name + uVar5,__s2,__n);
        if (iVar2 < 1) break;
        uVar1 = *(ushort *)(__s2 + 0x28);
        if (uVar1 == 0xffff) goto LAB_00113f33;
      }
      if (iVar2 != 0) break;
      uVar3 = uVar4;
      if (*(short *)(__s2 + 0x2c) != -1) {
        uVar3 = (uint)uVar1;
      }
      if (type != NDN_NAMETREE_FIB_TYPE) {
        uVar3 = uVar4;
      }
      uVar4 = uVar3;
      if (*(short *)(__s2 + 0x2a) != -1) {
        uVar4 = (uint)uVar1;
      }
      if (type != NDN_NAMETREE_PIT_TYPE) {
        uVar4 = uVar3;
      }
      uVar5 = uVar5 + uVar6;
      if (len <= uVar5) break;
    }
LAB_00113f33:
    if (uVar4 != 0xffff) {
      return (nametree_entry_t *)(nametree + (ulong)uVar4 * 0x2e);
    }
  }
  return (nametree_entry_t *)0x0;
}

Assistant:

nametree_entry_t*
ndn_nametree_prefix_match(
                          ndn_nametree_t* nametree,
                          uint8_t name[],
                          size_t len,
                          enum NDN_NAMETREE_ENTRY_TYPE type)
{
  int now_node, last_node = NDN_INVALID_ID , father = 0 , tmp;
  size_t component_len, eqiv_component_len, offset = 0;
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset,(*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp == 0) {
      if ((*nametree)[now_node].fib_id != NDN_INVALID_ID && type == NDN_NAMETREE_FIB_TYPE) last_node = now_node;
      if ((*nametree)[now_node].pit_id != NDN_INVALID_ID && type == NDN_NAMETREE_PIT_TYPE) last_node = now_node;
    } else break;
    offset += component_len;
    father = now_node;
  }
  if (last_node == NDN_INVALID_ID) return NULL; else return &(*nametree)[last_node];
}